

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFuncType
          (BinaryReaderInterp *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  ModuleDesc *this_00;
  Result RVar1;
  Enum EVar2;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_a8;
  void *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  FuncType local_70;
  
  RVar1 = SharedValidator::OnFuncType
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     param_count,param_types,result_count,result_types);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    this_00 = this->module_;
    local_88 = (void *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_88,param_types,
               param_types + param_count);
    local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_a8,result_types,
               result_types + result_count);
    local_70.super_ExternType.kind = First;
    local_70.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e48a0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_70.params,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_70.results,&local_a8);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
    emplace_back<wabt::interp::FuncType>(&this_00->func_types,&local_70);
    local_70.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e48a0;
    if (local_70.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88 != (void *)0x0) {
      operator_delete(local_88);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnFuncType(Index index,
                                      Index param_count,
                                      Type* param_types,
                                      Index result_count,
                                      Type* result_types) {
  CHECK_RESULT(validator_.OnFuncType(loc, param_count, param_types,
                                     result_count, result_types));
  module_.func_types.push_back(FuncType(ToInterp(param_count, param_types),
                                        ToInterp(result_count, result_types)));
  return Result::Ok;
}